

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::
DefaultFieldComparatorTest_FloatingPointComparisonWithinDefaultFractionOrMargin_Test::TestBody
          (DefaultFieldComparatorTest_FloatingPointComparisonWithinDefaultFractionOrMargin_Test
           *this)

{
  Descriptor *pDVar1;
  bool bVar2;
  FieldDescriptor *field;
  char *pcVar3;
  AssertHelper local_1e0;
  Message local_1d8;
  ComparisonResult local_1d0 [2];
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_9;
  Message local_1b0;
  ComparisonResult local_1a8 [2];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_8;
  Message local_188;
  ComparisonResult local_180 [2];
  undefined1 local_178 [8];
  AssertionResult gtest_ar_7;
  Message local_160;
  ComparisonResult local_158 [2];
  undefined1 local_150 [8];
  AssertionResult gtest_ar_6;
  Message local_138;
  ComparisonResult local_130 [2];
  undefined1 local_128 [8];
  AssertionResult gtest_ar_5;
  Message local_110;
  ComparisonResult local_108 [2];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_4;
  Message local_e8;
  ComparisonResult local_e0 [2];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_3;
  Message local_c0;
  ComparisonResult local_b8 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  ComparisonResult local_90 [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_60;
  ComparisonResult local_58 [2];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  FieldDescriptor *field_double;
  FieldDescriptor *local_18;
  FieldDescriptor *field_float;
  DefaultFieldComparatorTest_FloatingPointComparisonWithinDefaultFractionOrMargin_Test *this_local;
  
  pDVar1 = (this->super_DefaultFieldComparatorTest).descriptor_;
  field_float = (FieldDescriptor *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&field_double,"optional_float");
  local_18 = Descriptor::FindFieldByName(pDVar1,_field_double);
  pDVar1 = (this->super_DefaultFieldComparatorTest).descriptor_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "optional_double");
  field = Descriptor::FindFieldByName(pDVar1,stack0xffffffffffffffc0);
  proto2_unittest::TestAllTypes::set_optional_float
            (&(this->super_DefaultFieldComparatorTest).message_1_,100.0);
  proto2_unittest::TestAllTypes::set_optional_float
            (&(this->super_DefaultFieldComparatorTest).message_2_,109.9);
  proto2_unittest::TestAllTypes::set_optional_double
            (&(this->super_DefaultFieldComparatorTest).message_1_,100.0);
  proto2_unittest::TestAllTypes::set_optional_double
            (&(this->super_DefaultFieldComparatorTest).message_2_,109.9);
  SimpleFieldComparator::set_float_comparison
            (&(this->super_DefaultFieldComparatorTest).comparator_.super_SimpleFieldComparator,
             APPROXIMATE);
  local_58[1] = 1;
  local_58[0] = DefaultFieldComparator::Compare
                          (&(this->super_DefaultFieldComparatorTest).comparator_,
                           &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                           &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,
                           local_18,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_50,"FieldComparator::DIFFERENT",
             "comparator_.Compare(message_1_, message_2_, field_float, -1, -1, nullptr)",
             local_58 + 1,local_58);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar2) {
    testing::Message::Message(&local_60);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x193,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_90[1] = 1;
  local_90[0] = DefaultFieldComparator::Compare
                          (&(this->super_DefaultFieldComparatorTest).comparator_,
                           &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                           &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,field,
                           -1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_88,"FieldComparator::DIFFERENT",
             "comparator_.Compare(message_1_, message_2_, field_double, -1, -1, nullptr)",
             local_90 + 1,local_90);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x196,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  SimpleFieldComparator::SetDefaultFractionAndMargin
            (&(this->super_DefaultFieldComparatorTest).comparator_.super_SimpleFieldComparator,0.01,
             0.0);
  local_b8[1] = 1;
  local_b8[0] = DefaultFieldComparator::Compare
                          (&(this->super_DefaultFieldComparatorTest).comparator_,
                           &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                           &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,
                           local_18,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_b0,"FieldComparator::DIFFERENT",
             "comparator_.Compare(message_1_, message_2_, field_float, -1, -1, nullptr)",
             local_b8 + 1,local_b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x19e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_e0[1] = 1;
  local_e0[0] = DefaultFieldComparator::Compare
                          (&(this->super_DefaultFieldComparatorTest).comparator_,
                           &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                           &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,field,
                           -1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_d8,"FieldComparator::DIFFERENT",
             "comparator_.Compare(message_1_, message_2_, field_double, -1, -1, nullptr)",
             local_e0 + 1,local_e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x1a1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  SimpleFieldComparator::SetFractionAndMargin
            (&(this->super_DefaultFieldComparatorTest).comparator_.super_SimpleFieldComparator,
             local_18,0.2,0.0);
  local_108[1] = 0;
  local_108[0] = DefaultFieldComparator::Compare
                           (&(this->super_DefaultFieldComparatorTest).comparator_,
                            &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                            &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,
                            local_18,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_100,"FieldComparator::SAME",
             "comparator_.Compare(message_1_, message_2_, field_float, -1, -1, nullptr)",
             local_108 + 1,local_108);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x1ab,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_130[1] = 1;
  local_130[0] = DefaultFieldComparator::Compare
                           (&(this->super_DefaultFieldComparatorTest).comparator_,
                            &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                            &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,field
                            ,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_128,"FieldComparator::DIFFERENT",
             "comparator_.Compare(message_1_, message_2_, field_double, -1, -1, nullptr)",
             local_130 + 1,local_130);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x1b0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  SimpleFieldComparator::SetDefaultFractionAndMargin
            (&(this->super_DefaultFieldComparatorTest).comparator_.super_SimpleFieldComparator,0.2,
             0.0);
  local_158[1] = 0;
  local_158[0] = DefaultFieldComparator::Compare
                           (&(this->super_DefaultFieldComparatorTest).comparator_,
                            &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                            &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,field
                            ,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_150,"FieldComparator::SAME",
             "comparator_.Compare(message_1_, message_2_, field_double, -1, -1, nullptr)",
             local_158 + 1,local_158);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x1b7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_180[1] = 0;
  local_180[0] = DefaultFieldComparator::Compare
                           (&(this->super_DefaultFieldComparatorTest).comparator_,
                            &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                            &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,
                            local_18,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_178,"FieldComparator::SAME",
             "comparator_.Compare(message_1_, message_2_, field_float, -1, -1, nullptr)",
             local_180 + 1,local_180);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar2) {
    testing::Message::Message(&local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x1bc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  SimpleFieldComparator::SetFractionAndMargin
            (&(this->super_DefaultFieldComparatorTest).comparator_.super_SimpleFieldComparator,
             local_18,0.01,0.0);
  local_1a8[1] = 1;
  local_1a8[0] = DefaultFieldComparator::Compare
                           (&(this->super_DefaultFieldComparatorTest).comparator_,
                            &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                            &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,
                            local_18,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_1a0,"FieldComparator::DIFFERENT",
             "comparator_.Compare(message_1_, message_2_, field_float, -1, -1, nullptr)",
             local_1a8 + 1,local_1a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar2) {
    testing::Message::Message(&local_1b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x1c4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1d0[1] = 0;
  local_1d0[0] = DefaultFieldComparator::Compare
                           (&(this->super_DefaultFieldComparatorTest).comparator_,
                            &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                            &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,field
                            ,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_1c8,"FieldComparator::SAME",
             "comparator_.Compare(message_1_, message_2_, field_double, -1, -1, nullptr)",
             local_1d0 + 1,local_1d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x1c7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  return;
}

Assistant:

TEST_F(DefaultFieldComparatorTest,
       FloatingPointComparisonWithinDefaultFractionOrMargin) {
  const FieldDescriptor* field_float =
      descriptor_->FindFieldByName("optional_float");
  const FieldDescriptor* field_double =
      descriptor_->FindFieldByName("optional_double");

  message_1_.set_optional_float(100.0f);
  message_2_.set_optional_float(109.9f);
  message_1_.set_optional_double(100.0);
  message_2_.set_optional_double(109.9);

  comparator_.set_float_comparison(DefaultFieldComparator::APPROXIMATE);
  EXPECT_EQ(FieldComparator::DIFFERENT,
            comparator_.Compare(message_1_, message_2_, field_float, -1, -1,
                                nullptr));
  EXPECT_EQ(FieldComparator::DIFFERENT,
            comparator_.Compare(message_1_, message_2_, field_double, -1, -1,
                                nullptr));

  // Set default fraction and margin.
  comparator_.SetDefaultFractionAndMargin(0.01, 0.0);

  // Float comparisons should fail since the fraction is too low.
  EXPECT_EQ(FieldComparator::DIFFERENT,
            comparator_.Compare(message_1_, message_2_, field_float, -1, -1,
                                nullptr));
  EXPECT_EQ(FieldComparator::DIFFERENT,
            comparator_.Compare(message_1_, message_2_, field_double, -1, -1,
                                nullptr));

  // Set field-specific fraction and margin for one field (field_float) but not
  // the other (field_double)
  comparator_.SetFractionAndMargin(field_float, 0.2, 0.0);

  // The field with the override should succeed, since its field-specific
  // fraction is high enough.
  EXPECT_EQ(FieldComparator::SAME,
            comparator_.Compare(message_1_, message_2_, field_float, -1, -1,
                                nullptr));
  // The field with no override should fail, since the default fraction is too
  // low
  EXPECT_EQ(FieldComparator::DIFFERENT,
            comparator_.Compare(message_1_, message_2_, field_double, -1, -1,
                                nullptr));

  // Set the default fraction and margin high enough so that fields that use
  // the default should succeed
  comparator_.SetDefaultFractionAndMargin(0.2, 0.0);
  EXPECT_EQ(FieldComparator::SAME,
            comparator_.Compare(message_1_, message_2_, field_double, -1, -1,
                                nullptr));

  // The field with an override should still be OK
  EXPECT_EQ(FieldComparator::SAME,
            comparator_.Compare(message_1_, message_2_, field_float, -1, -1,
                                nullptr));

  // Set fraction and margin for the field with an override to be too low
  comparator_.SetFractionAndMargin(field_float, 0.01, 0.0);

  // Now our default is high enough but field_float's override is too low.
  EXPECT_EQ(FieldComparator::DIFFERENT,
            comparator_.Compare(message_1_, message_2_, field_float, -1, -1,
                                nullptr));
  EXPECT_EQ(FieldComparator::SAME,
            comparator_.Compare(message_1_, message_2_, field_double, -1, -1,
                                nullptr));
}